

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifierValidator.cpp
# Opt level: O0

Result_conflict *
CoreML::validate<(MLModelType)2000>(Result_conflict *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar1;
  uint32 uVar2;
  ClassLabelsCase CVar3;
  CoreML *pCVar4;
  StringVector *this;
  ulong uVar5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_1b1;
  string local_1b0;
  string local_188;
  int numClassLabels;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_140;
  TextClassifier *textClassifier;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  undefined1 local_a8 [48];
  Result_conflict result;
  allocator local_41;
  string local_40;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_40._M_storage._M_storage = (uchar  [8])Specification::Model::description(format);
  bVar1 = Specification::Model::has_textclassifier((Model *)interface);
  if (bVar1) {
    Result::Result((Result *)(local_a8 + 0x28));
    pCVar4 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)local_40._M_storage._M_storage);
    local_d4 = kStringType;
    local_d0 = &local_d4;
    local_c8 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_d5);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_a8,pCVar4,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_c0,
               in_R8);
    Result::operator=((Result *)(local_a8 + 0x28),(Result *)local_a8);
    Result::~Result((Result *)local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
    bVar1 = Result::good((Result *)(local_a8 + 0x28));
    if (bVar1) {
      pCVar4 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)local_40._M_storage._M_storage);
      textClassifier._4_4_ = 3;
      local_130 = (iterator)((long)&textClassifier + 4);
      local_128 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 ((long)&textClassifier + 3));
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_120,__l,
               (allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&textClassifier + 3));
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_108,pCVar4,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_120,
                 in_R8);
      Result::operator=((Result *)(local_a8 + 0x28),&local_108);
      Result::~Result(&local_108);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_120);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 ((long)&textClassifier + 3));
      bVar1 = Result::good((Result *)(local_a8 + 0x28));
      if (bVar1) {
        local_140._M_storage = (uchar  [8])Specification::Model::textclassifier((Model *)interface);
        uVar2 = Specification::CoreMLModels::TextClassifier::revision
                          ((TextClassifier *)local_140._M_storage);
        if (uVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&numClassLabels,"Model revision number not set. Must be >= 1",
                     (allocator *)(local_188._M_storage._M_storage + 7));
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                         (string *)&numClassLabels);
          std::__cxx11::string::~string((string *)&numClassLabels);
          std::allocator<char>::~allocator((allocator<char> *)(local_188._M_storage._M_storage + 7))
          ;
        }
        else {
          CVar3 = Specification::CoreMLModels::TextClassifier::ClassLabels_case
                            ((TextClassifier *)local_140._M_storage);
          if (CVar3 == CLASSLABELS_NOT_SET) {
            local_188._M_storage._M_storage[0] = 0xff;
            local_188._M_storage._M_storage[1] = 0xff;
            local_188._M_storage._M_storage[2] = 0xff;
            local_188._M_storage._M_storage[3] = 0xff;
          }
          else if (CVar3 == kStringClassLabels) {
            this = Specification::CoreMLModels::TextClassifier::stringclasslabels
                             ((TextClassifier *)local_140._M_storage);
            local_188._M_storage._M_storage._0_4_ = Specification::StringVector::vector_size(this);
          }
          if ((int)local_188._M_storage._M_storage._0_4_ < 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_188,
                       "Model output class label not set. Must have at least one class label",
                       (allocator *)(local_1b0._M_storage._M_storage + 7));
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(local_1b0._M_storage._M_storage + 7));
          }
          else {
            Specification::CoreMLModels::TextClassifier::modelparameterdata_abi_cxx11_
                      ((TextClassifier *)local_140._M_storage);
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              Result::Result((Result *)__return_storage_ptr__,(Result *)(local_a8 + 0x28));
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1b0,"Model parameter data not set",&local_1b1);
              Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
            }
          }
        }
      }
      else {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_a8 + 0x28));
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_a8 + 0x28));
    }
    local_108.m_message._M_storage._M_storage[4] = '\x01';
    local_108.m_message._M_storage._M_storage[5] = '\0';
    local_108.m_message._M_storage._M_storage[6] = '\0';
    local_108.m_message._M_storage._M_storage[7] = '\0';
    Result::~Result((Result *)(local_a8 + 0x28));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Model not a text classifier.",&local_41);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_textClassifier>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a word tager
        if (!format.has_textclassifier()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a text classifier.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only three outputs with sequence type are allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &textClassifier = format.textclassifier();
        if (textClassifier.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }
        
        int numClassLabels;
        switch (textClassifier.ClassLabels_case()) {
            case Specification::CoreMLModels::TextClassifier::kStringClassLabels:
                numClassLabels = textClassifier.stringclasslabels().vector_size();
                break;
            case Specification::CoreMLModels::TextClassifier::CLASSLABELS_NOT_SET:
                numClassLabels = -1;
                break;
        }
        
        if (numClassLabels <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output class label not set. Must have at least one class label");
        }
        
        if (textClassifier.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }